

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lights.cpp
# Opt level: O0

void __thiscall DFireFlicker::Tick(DFireFlicker *this)

{
  int iVar1;
  uint uVar2;
  int amount;
  DFireFlicker *this_local;
  
  iVar1 = this->m_Count + -1;
  this->m_Count = iVar1;
  if (iVar1 == 0) {
    uVar2 = FRandom::operator()(&pr_fireflicker);
    if ((int)((int)((this->super_DLighting).super_DSectorEffect.m_Sector)->lightlevel +
             (uVar2 & 3) * -0x10) < this->m_MinLight) {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,this->m_MinLight);
    }
    else {
      sector_t::SetLightLevel
                ((sector_t *)(this->super_DLighting).super_DSectorEffect.m_Sector,
                 this->m_MaxLight + (uVar2 & 3) * -0x10);
    }
    this->m_Count = 4;
  }
  return;
}

Assistant:

void DFireFlicker::Tick ()
{
	int amount;

	if (--m_Count == 0)
	{
		amount = (pr_fireflicker() & 3) << 4;

		// [RH] Shouldn't this be (m_MaxLight - amount < m_MinLight)?
		if (m_Sector->lightlevel - amount < m_MinLight)
			m_Sector->SetLightLevel(m_MinLight);
		else
			m_Sector->SetLightLevel(m_MaxLight - amount);

		m_Count = 4;
	}
}